

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O1

bc_trie_t * blogc_source_parse_from_file(bc_trie_t *conf,char *f,bc_error_t **err)

{
  int toctree_maxdepth;
  char *src;
  char *pcVar1;
  bc_trie_t *trie;
  char *endptr;
  size_t len;
  char *local_38;
  size_t local_30;
  ulong uVar2;
  
  if (((err != (bc_error_t **)0x0) && (*err == (bc_error_t *)0x0)) &&
     (src = bc_file_get_contents(f,true,&local_30,err), src != (char *)0x0)) {
    pcVar1 = (char *)bc_trie_lookup(conf,"TOCTREE_MAXDEPTH");
    if (pcVar1 == (char *)0x0) {
      toctree_maxdepth = -1;
    }
    else {
      uVar2 = strtol(pcVar1,&local_38,10);
      toctree_maxdepth = (int)uVar2;
      if ((*pcVar1 != '\0') && (*local_38 != '\0')) {
        fprintf(_stderr,
                "warning: invalid value for \'TOCTREE_MAXDEPTH\' variable: %s. using %d instead\n",
                pcVar1,uVar2 & 0xffffffff);
      }
    }
    trie = blogc_source_parse(src,local_30,toctree_maxdepth,err);
    if ((trie != (bc_trie_t *)0x0) && (pcVar1 = blogc_get_filename(f), pcVar1 != (char *)0x0)) {
      bc_trie_insert(trie,"FILENAME",pcVar1);
    }
    free(src);
    return trie;
  }
  return (bc_trie_t *)0x0;
}

Assistant:

bc_trie_t*
blogc_source_parse_from_file(bc_trie_t *conf, const char *f, bc_error_t **err)
{
    if (err == NULL || *err != NULL)
        return NULL;

    size_t len;
    char *s = bc_file_get_contents(f, true, &len, err);
    if (s == NULL)
        return NULL;

    int toctree_maxdepth = -1;
    const char *maxdepth = bc_trie_lookup(conf, "TOCTREE_MAXDEPTH");
    if (maxdepth != NULL) {
        char *endptr;
        toctree_maxdepth = strtol(maxdepth, &endptr, 10);
        if (*maxdepth != '\0' && *endptr != '\0') {
            fprintf(stderr, "warning: invalid value for 'TOCTREE_MAXDEPTH' "
                "variable: %s. using %d instead\n", maxdepth, toctree_maxdepth);
        }
    }

    bc_trie_t *rv = blogc_source_parse(s, len, toctree_maxdepth, err);

    // set FILENAME variable
    if (rv != NULL) {
        char *filename = blogc_get_filename(f);
        if (filename != NULL)
            bc_trie_insert(rv, "FILENAME", filename);
    }

    free(s);
    return rv;
}